

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

void polyscope::view::processRotate(vec2 startP,vec2 endP)

{
  vec2 v;
  vec2 v_00;
  undefined1 auVar1 [16];
  bool bVar2;
  NavigateStyle NVar3;
  col_type *pcVar4;
  float *pfVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  float fVar8;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar9;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 aVar10;
  undefined8 uVar24;
  undefined1 in_ZMM0 [64];
  undefined1 auVar11 [64];
  undefined1 auVar25 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar23 [64];
  undefined1 in_ZMM1 [64];
  vec<3,_float,_(glm::qualifier)0> vVar26;
  vec3 vVar27;
  col_type cVar28;
  mat4x4 phiCamR_2;
  mat4x4 thetaCamR_2;
  vec3 rotAx;
  float delPhi_2;
  float delTheta_2;
  vec2 dragDelta_2;
  mat4 update;
  int j;
  int i;
  mat4x4 R;
  mat4 cameraRotate;
  double rotMag;
  vec3 rotAxis;
  vec3 sphereEnd;
  vec3 sphereStart;
  anon_class_1_0_00000001 toSphere;
  mat4x4 phiCamR_1;
  mat4x4 thetaCamR_1;
  float delPhi_1;
  float delTheta_1;
  vec2 dragDelta_1;
  mat4x4 thetaCamR;
  vec3 turntableUp;
  mat4x4 phiCamR;
  float delPhi;
  float delTheta;
  vec2 dragDelta;
  vec3 frameRightDir;
  vec3 frameUpDir;
  vec3 frameLookDir;
  undefined4 in_stack_fffffffffffff5b8;
  float in_stack_fffffffffffff5bc;
  vec<3,_float,_(glm::qualifier)0> *in_stack_fffffffffffff5c0;
  mat<4,_4,_float,_(glm::qualifier)0> *this;
  undefined4 in_stack_fffffffffffff5c8;
  undefined4 in_stack_fffffffffffff5cc;
  mat<3,_3,_float,_(glm::qualifier)0> *in_stack_fffffffffffff5d0;
  undefined4 in_stack_fffffffffffff5d8;
  undefined4 in_stack_fffffffffffff5dc;
  vec<3,_float,_(glm::qualifier)0> *in_stack_fffffffffffff5e0;
  row_type *in_stack_fffffffffffff5f8;
  mat<3,_3,_float,_(glm::qualifier)0> *in_stack_fffffffffffff600;
  undefined1 *puVar29;
  anon_class_1_0_00000001 *in_stack_fffffffffffff618;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 in_stack_fffffffffffff624;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 in_stack_fffffffffffff628;
  vec<3,_float,_(glm::qualifier)0> *in_stack_fffffffffffff658;
  mat<4,_4,_float,_(glm::qualifier)0> *in_stack_fffffffffffff660;
  vec<3,_float,_(glm::qualifier)0> local_964;
  undefined4 local_958;
  vec3 *in_stack_fffffffffffff6d0;
  vec3 *in_stack_fffffffffffff6d8;
  vec3 *in_stack_fffffffffffff6e0;
  undefined1 local_8d4 [64];
  undefined4 local_894;
  undefined8 local_810;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 local_808;
  undefined8 local_800;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_7f8;
  undefined8 local_7f0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_7e8;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 in_stack_fffffffffffff840;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 in_stack_fffffffffffff844;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar30;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 in_stack_fffffffffffff84c;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 angle;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 in_stack_fffffffffffff850;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 in_stack_fffffffffffff854;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 local_7a8;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aStack_7a4;
  undefined1 local_7a0 [8];
  mat<4,_4,_float,_(glm::qualifier)0> *in_stack_fffffffffffff868;
  mat<4,_4,_float,_(glm::qualifier)0> *in_stack_fffffffffffff870;
  int local_6a0;
  int local_69c;
  mat<4,_4,_float,_(glm::qualifier)0> local_698;
  vec<3,_float,_(glm::qualifier)0> local_658;
  undefined4 local_64c;
  double local_5c8;
  undefined8 local_5c0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_5b8;
  undefined8 local_5b0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_5a8;
  undefined8 local_5a0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_598;
  undefined8 local_594;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_58c;
  undefined8 local_588;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_580;
  undefined8 local_578;
  undefined8 local_570;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_568;
  undefined8 local_560;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_558;
  undefined8 local_550;
  undefined8 local_548;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_540;
  undefined8 local_538;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_530;
  undefined8 local_528;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_520;
  undefined8 local_518;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_510;
  undefined8 local_50c;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_504;
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined4 local_480;
  undefined1 local_3fc [64];
  undefined4 local_3bc;
  undefined8 local_338;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_330;
  undefined8 local_328;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_320;
  undefined1 local_318 [64];
  float local_2d8;
  float local_2d4;
  undefined8 local_2d0;
  undefined8 local_2c8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_2c0;
  undefined8 local_2b8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_2b0;
  undefined8 local_2a8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_2a0;
  undefined8 local_29c;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_294;
  undefined1 local_290 [64];
  undefined1 local_250 [64];
  undefined8 local_210;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_208;
  undefined8 local_200;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_1f8;
  undefined4 local_1f4;
  undefined1 local_164 [64];
  undefined4 local_124;
  undefined8 local_a0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_98;
  undefined8 local_90;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_88;
  undefined1 local_84 [64];
  float local_44;
  float local_40;
  undefined8 local_3c;
  undefined8 local_10;
  undefined8 local_8;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  local_8 = vmovlpd_avx(in_ZMM0._0_16_);
  local_10 = vmovlpd_avx(in_ZMM1._0_16_);
  bVar2 = glm::operator==((vec<2,_float,_(glm::qualifier)0> *)in_stack_fffffffffffff5c0,
                          (vec<2,_float,_(glm::qualifier)0> *)
                          CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8));
  if (!bVar2) {
    getCameraFrame(in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
    NVar3 = getNavigateStyle();
    switch(NVar3) {
    case Turntable:
      auVar11._0_8_ =
           glm::operator-((vec<2,_float,_(glm::qualifier)0> *)
                          CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
                          (vec<2,_float,_(glm::qualifier)0> *)0x3daf7b);
      auVar11._8_56_ = extraout_var;
      uVar24 = vmovlpd_avx(auVar11._0_16_);
      local_3c._0_4_ = (float)uVar24;
      local_40 = (float)(((double)(float)local_3c + (double)(float)local_3c) * moveScale);
      local_3c._4_4_ = (float)((ulong)uVar24 >> 0x20);
      local_44 = (float)(((double)local_3c._4_4_ + (double)local_3c._4_4_) * moveScale);
      auVar25 = ZEXT856(0);
      local_3c = uVar24;
      vVar27 = polyscope::state::center();
      local_98 = vVar27.field_2;
      auVar12._0_8_ = vVar27._0_8_;
      auVar12._8_56_ = auVar25;
      local_a0 = vmovlpd_avx(auVar12._0_16_);
      local_90 = local_a0;
      local_88 = local_98;
      glm::translate<float,(glm::qualifier)0>(in_stack_fffffffffffff660,in_stack_fffffffffffff658);
      auVar6 = vmovdqu64_avx512f(local_84);
      viewMat = vmovdqu64_avx512f(auVar6);
      local_124 = 0x3f800000;
      glm::mat<4,_4,_float,_(glm::qualifier)0>::mat
                ((mat<4,_4,_float,_(glm::qualifier)0> *)in_stack_fffffffffffff5c0,
                 (float *)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8));
      glm::rotate<float,(glm::qualifier)0>
                ((mat<4,_4,_float,_(glm::qualifier)0> *)
                 CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                 in_stack_fffffffffffff84c.w,
                 (vec<3,_float,_(glm::qualifier)0> *)
                 CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
      glm::operator*(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
      auVar6 = vmovdqu64_avx512f(local_164);
      viewMat = vmovdqu64_avx512f(auVar6);
      local_1f4 = 0x3f800000;
      glm::mat<4,_4,_float,_(glm::qualifier)0>::mat
                ((mat<4,_4,_float,_(glm::qualifier)0> *)in_stack_fffffffffffff5c0,
                 (float *)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8));
      uVar24 = 0;
      vVar27 = getUpVec();
      local_208 = vVar27.field_2;
      auVar1._8_8_ = uVar24;
      auVar1._0_8_ = vVar27._0_8_;
      local_210 = vmovlpd_avx(auVar1);
      local_200 = local_210;
      local_1f8 = local_208;
      glm::rotate<float,(glm::qualifier)0>
                ((mat<4,_4,_float,_(glm::qualifier)0> *)
                 CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                 in_stack_fffffffffffff84c.w,
                 (vec<3,_float,_(glm::qualifier)0> *)
                 CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
      glm::operator*(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
      auVar6 = vmovdqu64_avx512f(local_250);
      viewMat = vmovdqu64_avx512f(auVar6);
      auVar25 = ZEXT856(auVar6._8_8_);
      vVar27 = polyscope::state::center();
      local_2b0 = vVar27.field_2;
      auVar13._0_8_ = vVar27._0_8_;
      auVar13._8_56_ = auVar25;
      local_2b8 = vmovlpd_avx(auVar13._0_16_);
      local_2a8 = local_2b8;
      local_2a0 = local_2b0;
      vVar26 = glm::operator-(in_stack_fffffffffffff5c0);
      local_2c0 = vVar26.field_2;
      auVar14._0_8_ = vVar26._0_8_;
      auVar14._8_56_ = auVar25;
      local_2c8 = vmovlpd_avx(auVar14._0_16_);
      local_29c = local_2c8;
      local_294 = local_2c0;
      glm::translate<float,(glm::qualifier)0>(in_stack_fffffffffffff660,in_stack_fffffffffffff658);
      memcpy(viewMat,local_290,0x40);
      break;
    case Free:
      auVar15._0_8_ =
           glm::operator-((vec<2,_float,_(glm::qualifier)0> *)
                          CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
                          (vec<2,_float,_(glm::qualifier)0> *)0x3db27b);
      auVar15._8_56_ = extraout_var_00;
      uVar24 = vmovlpd_avx(auVar15._0_16_);
      local_2d0._0_4_ = (float)uVar24;
      local_2d4 = (float)(((double)(float)local_2d0 + (double)(float)local_2d0) * moveScale);
      local_2d0._4_4_ = (float)((ulong)uVar24 >> 0x20);
      local_2d8 = (float)(((double)local_2d0._4_4_ + (double)local_2d0._4_4_) * moveScale);
      auVar25 = ZEXT856(0);
      local_2d0 = uVar24;
      vVar27 = polyscope::state::center();
      local_330 = vVar27.field_2;
      auVar16._0_8_ = vVar27._0_8_;
      auVar16._8_56_ = auVar25;
      local_338 = vmovlpd_avx(auVar16._0_16_);
      puVar29 = viewMat;
      local_328 = local_338;
      local_320 = local_330;
      glm::translate<float,(glm::qualifier)0>(in_stack_fffffffffffff660,in_stack_fffffffffffff658);
      auVar6 = vmovdqu64_avx512f(local_318);
      auVar6 = vmovdqu64_avx512f(auVar6);
      *(undefined1 (*) [64])puVar29 = auVar6;
      local_3bc = 0x3f800000;
      glm::mat<4,_4,_float,_(glm::qualifier)0>::mat
                ((mat<4,_4,_float,_(glm::qualifier)0> *)in_stack_fffffffffffff5c0,
                 (float *)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8));
      glm::rotate<float,(glm::qualifier)0>
                ((mat<4,_4,_float,_(glm::qualifier)0> *)
                 CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                 in_stack_fffffffffffff84c.w,
                 (vec<3,_float,_(glm::qualifier)0> *)
                 CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
      glm::operator*(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
      auVar6 = vmovdqu64_avx512f(local_3fc);
      auVar6 = vmovdqu64_avx512f(auVar6);
      *(undefined1 (*) [64])puVar29 = auVar6;
      local_480 = 0x3f800000;
      glm::mat<4,_4,_float,_(glm::qualifier)0>::mat
                ((mat<4,_4,_float,_(glm::qualifier)0> *)in_stack_fffffffffffff5c0,
                 (float *)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8));
      glm::rotate<float,(glm::qualifier)0>
                ((mat<4,_4,_float,_(glm::qualifier)0> *)
                 CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                 in_stack_fffffffffffff84c.w,
                 (vec<3,_float,_(glm::qualifier)0> *)
                 CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
      glm::operator*(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
      auVar7 = vmovdqu64_avx512f(local_4c0);
      auVar6 = vmovdqu64_avx512f(auVar7);
      *(undefined1 (*) [64])puVar29 = auVar6;
      auVar25 = ZEXT856(auVar7._8_8_);
      vVar27 = polyscope::state::center();
      local_520 = vVar27.field_2;
      auVar17._0_8_ = vVar27._0_8_;
      auVar17._8_56_ = auVar25;
      local_528 = vmovlpd_avx(auVar17._0_16_);
      local_518 = local_528;
      local_510 = local_520;
      vVar26 = glm::operator-(in_stack_fffffffffffff5c0);
      local_530 = vVar26.field_2;
      auVar18._0_8_ = vVar26._0_8_;
      auVar18._8_56_ = auVar25;
      local_538 = vmovlpd_avx(auVar18._0_16_);
      local_50c = local_538;
      local_504 = local_530;
      glm::translate<float,(glm::qualifier)0>(in_stack_fffffffffffff660,in_stack_fffffffffffff658);
      memcpy(viewMat,local_500,0x40);
      break;
    case Planar:
      break;
    case Arcball:
      local_550 = local_8;
      auVar25 = ZEXT856(0);
      v.field_1 = in_stack_fffffffffffff628;
      v.field_0 = in_stack_fffffffffffff624;
      vVar27 = processRotate::anon_class_1_0_00000001::operator()(in_stack_fffffffffffff618,v);
      local_558 = vVar27.field_2;
      auVar19._0_8_ = vVar27._0_8_;
      auVar19._8_56_ = auVar25;
      local_560 = vmovlpd_avx(auVar19._0_16_);
      local_578 = local_10;
      auVar25 = ZEXT856(0);
      v_00.field_1 = in_stack_fffffffffffff628;
      v_00.field_0 = in_stack_fffffffffffff624;
      local_548 = local_560;
      local_540 = local_558;
      vVar27 = processRotate::anon_class_1_0_00000001::operator()(in_stack_fffffffffffff618,v_00);
      local_580 = vVar27.field_2;
      auVar20._0_8_ = vVar27._0_8_;
      auVar20._8_56_ = auVar25;
      local_588 = vmovlpd_avx(auVar20._0_16_);
      local_570 = local_588;
      local_568 = local_580;
      vVar26 = glm::cross<float,(glm::qualifier)0>
                         (in_stack_fffffffffffff5e0,
                          (vec<3,_float,_(glm::qualifier)0> *)
                          CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
      local_5a8 = vVar26.field_2;
      auVar21._0_8_ = vVar26._0_8_;
      auVar21._8_56_ = auVar25;
      local_5b0 = vmovlpd_avx(auVar21._0_16_);
      local_5a0 = local_5b0;
      local_598 = local_5a8;
      vVar26 = glm::operator-(in_stack_fffffffffffff5c0);
      local_5b8 = vVar26.field_2;
      auVar22._0_8_ = vVar26._0_8_;
      auVar22._8_56_ = auVar25;
      local_5c0 = vmovlpd_avx(auVar22._0_16_);
      local_594 = local_5c0;
      local_58c = local_5b8;
      glm::dot<3,float,(glm::qualifier)0>
                (in_stack_fffffffffffff5c0,
                 (vec<3,_float,_(glm::qualifier)0> *)
                 CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8));
      fVar8 = glm::clamp<float>((float)((ulong)in_stack_fffffffffffff5c0 >> 0x20),
                                SUB84(in_stack_fffffffffffff5c0,0),in_stack_fffffffffffff5bc);
      local_5c8 = acos((double)fVar8 * moveScale);
      local_64c = 0x3f800000;
      glm::mat<4,_4,_float,_(glm::qualifier)0>::mat
                ((mat<4,_4,_float,_(glm::qualifier)0> *)in_stack_fffffffffffff5c0,
                 (float *)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8));
      glm::vec<3,_float,_(glm::qualifier)0>::vec
                (&local_658,(float)local_594,local_594._4_4_,local_58c.z);
      glm::rotate<float,(glm::qualifier)0>
                ((mat<4,_4,_float,_(glm::qualifier)0> *)
                 CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                 in_stack_fffffffffffff84c.w,
                 (vec<3,_float,_(glm::qualifier)0> *)
                 CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
      for (local_69c = 0; local_69c < 3; local_69c = local_69c + 1) {
        for (local_6a0 = 0; local_6a0 < 3; local_6a0 = local_6a0 + 1) {
          pcVar4 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[]
                             ((mat<4,_4,_float,_(glm::qualifier)0> *)viewMat,local_69c);
          pfVar5 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](pcVar4,local_6a0);
          fVar8 = *pfVar5;
          pcVar4 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[](&local_698,local_69c);
          pfVar5 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](pcVar4,local_6a0);
          *pfVar5 = fVar8;
        }
      }
      pcVar4 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[](&local_698,3);
      pfVar5 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](pcVar4,3);
      *pfVar5 = 1.0;
      glm::inverse<4,4,float,(glm::qualifier)0>
                ((mat<4,_4,_float,_(glm::qualifier)0> *)in_stack_fffffffffffff5c0);
      glm::operator*(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
      glm::operator*(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
      glm::operator*(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
      memcpy(viewMat,local_7a0,0x40);
      break;
    case None:
      break;
    case FirstPerson:
      auVar6._0_8_ = glm::operator-((vec<2,_float,_(glm::qualifier)0> *)
                                    CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
                                    (vec<2,_float,_(glm::qualifier)0> *)0x3db87d);
      auVar6._8_56_ = extraout_var_01;
      uVar24 = vmovlpd_avx(auVar6._0_16_);
      local_7a8 = SUB84(uVar24,0);
      aVar9.y = (float)(((double)local_7a8.z + (double)local_7a8.z) * moveScale);
      aStack_7a4 = SUB84((ulong)uVar24 >> 0x20,0);
      aVar10.x = (float)(((double)aStack_7a4.w + (double)aStack_7a4.w) * moveScale);
      auVar25 = ZEXT856(0);
      this = (mat<4,_4,_float,_(glm::qualifier)0> *)&stack0xfffffffffffff820;
      glm::mat<3,_3,_float,_(glm::qualifier)0>::mat
                (in_stack_fffffffffffff5d0,
                 (mat<4,_4,_float,_(glm::qualifier)0> *)
                 CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
      vVar27 = getUpVec();
      local_7f8 = vVar27.field_2;
      auVar7._0_8_ = vVar27._0_8_;
      auVar7._8_56_ = auVar25;
      local_800 = vmovlpd_avx(auVar7._0_16_);
      local_7f0 = local_800;
      local_7e8 = local_7f8;
      cVar28 = glm::operator*(in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
      local_808 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)cVar28.field_2;
      auVar23._0_8_ = cVar28._0_8_;
      auVar23._8_56_ = auVar25;
      local_810 = vmovlpd_avx(auVar23._0_16_);
      aVar30 = SUB84(local_810,0);
      local_894 = 0x3f800000;
      angle = local_808;
      glm::mat<4,_4,_float,_(glm::qualifier)0>::mat
                (this,(float *)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8));
      glm::rotate<float,(glm::qualifier)0>
                ((mat<4,_4,_float,_(glm::qualifier)0> *)CONCAT44(aVar9,aVar10),angle.w,
                 (vec<3,_float,_(glm::qualifier)0> *)CONCAT44(aVar30,in_stack_fffffffffffff840));
      glm::operator*(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
      memcpy(viewMat,local_8d4,0x40);
      local_958 = 0x3f800000;
      glm::mat<4,_4,_float,_(glm::qualifier)0>::mat
                (this,(float *)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8));
      glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_964,1.0,0.0,0.0);
      glm::rotate<float,(glm::qualifier)0>
                ((mat<4,_4,_float,_(glm::qualifier)0> *)CONCAT44(aVar9,aVar10),angle.w,
                 (vec<3,_float,_(glm::qualifier)0> *)CONCAT44(aVar30,in_stack_fffffffffffff840));
      glm::operator*(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
      memcpy(viewMat,&stack0xfffffffffffff65c,0x40);
    }
    requestRedraw();
    immediatelyEndFlight();
  }
  return;
}

Assistant:

void processRotate(glm::vec2 startP, glm::vec2 endP) {

  if (startP == endP) {
    return;
  }

  // Get frame
  glm::vec3 frameLookDir, frameUpDir, frameRightDir;
  getCameraFrame(frameLookDir, frameUpDir, frameRightDir);

  switch (getNavigateStyle()) {
  case NavigateStyle::Turntable: {

    glm::vec2 dragDelta = endP - startP;
    float delTheta = 2.0 * dragDelta.x * moveScale;
    float delPhi = 2.0 * dragDelta.y * moveScale;

    // Translate to center
    viewMat = glm::translate(viewMat, state::center());

    // Rotation about the horizontal axis
    glm::mat4x4 phiCamR = glm::rotate(glm::mat4x4(1.0), -delPhi, frameRightDir);
    viewMat = viewMat * phiCamR;

    // Rotation about the vertical axis
    glm::vec3 turntableUp;
    glm::mat4x4 thetaCamR = glm::rotate(glm::mat4x4(1.0), delTheta, getUpVec());
    viewMat = viewMat * thetaCamR;

    // Undo centering
    viewMat = glm::translate(viewMat, -state::center());
    break;
  }
  case NavigateStyle::Free: {
    glm::vec2 dragDelta = endP - startP;
    float delTheta = 2.0 * dragDelta.x * moveScale;
    float delPhi = 2.0 * dragDelta.y * moveScale;

    // Translate to center
    viewMat = glm::translate(viewMat, state::center());

    // Rotation about the vertical axis
    glm::mat4x4 thetaCamR = glm::rotate(glm::mat4x4(1.0), delTheta, frameUpDir);
    viewMat = viewMat * thetaCamR;

    // Rotation about the horizontal axis
    glm::mat4x4 phiCamR = glm::rotate(glm::mat4x4(1.0), -delPhi, frameRightDir);
    viewMat = viewMat * phiCamR;

    // Undo centering
    viewMat = glm::translate(viewMat, -state::center());
    break;
  }
  case NavigateStyle::Planar: {
    // Do nothing
    break;
  }
  case NavigateStyle::Arcball: {
    // Map inputs to unit sphere
    auto toSphere = [](glm::vec2 v) {
      double x = glm::clamp(v.x, -1.0f, 1.0f);
      double y = glm::clamp(v.y, -1.0f, 1.0f);
      double mag = x * x + y * y;
      if (mag <= 1.0) {
        return glm::vec3{x, y, -std::sqrt(1.0 - mag)};
      } else {
        return glm::normalize(glm::vec3{x, y, 0.0});
      }
    };
    glm::vec3 sphereStart = toSphere(startP);
    glm::vec3 sphereEnd = toSphere(endP);

    glm::vec3 rotAxis = -cross(sphereStart, sphereEnd);
    double rotMag = std::acos(glm::clamp(dot(sphereStart, sphereEnd), -1.0f, 1.0f) * moveScale);

    glm::mat4 cameraRotate = glm::rotate(glm::mat4x4(1.0), (float)rotMag, glm::vec3(rotAxis.x, rotAxis.y, rotAxis.z));

    // Get current camera rotation
    glm::mat4x4 R;
    for (int i = 0; i < 3; i++) {
      for (int j = 0; j < 3; j++) {
        R[i][j] = viewMat[i][j];
      }
    }
    R[3][3] = 1.0;

    glm::mat4 update = glm::inverse(R) * cameraRotate * R;

    viewMat = viewMat * update;
    break;
  }
  case NavigateStyle::None: {
    // Do nothing
    break;
  }
  case NavigateStyle::FirstPerson: {
    glm::vec2 dragDelta = endP - startP;
    float delTheta = 2.0 * dragDelta.x * moveScale;
    float delPhi = 2.0 * dragDelta.y * moveScale;

    // Rotation about the vertical axis
    glm::vec3 rotAx = glm::mat3(viewMat) * getUpVec();
    glm::mat4x4 thetaCamR = glm::rotate(glm::mat4x4(1.0), delTheta, rotAx);
    viewMat = thetaCamR * viewMat;

    // Rotation about the horizontal axis
    glm::mat4x4 phiCamR = glm::rotate(glm::mat4x4(1.0), -delPhi, glm::vec3(1.f, 0.f, 0.f));
    viewMat = phiCamR * viewMat;

    break;
  }
  }

  requestRedraw();
  immediatelyEndFlight();
}